

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O0

void slab_arena_destroy(slab_arena *arena)

{
  void *addr;
  size_t local_20;
  size_t total;
  void *ptr;
  slab_arena *arena_local;
  
  local_20 = 0;
  while( true ) {
    addr = lf_lifo_pop(&arena->cache);
    if (addr == (void *)0x0) break;
    if (((arena->arena == (void *)0x0) || (addr < arena->arena)) ||
       ((void *)((long)arena->arena + arena->prealloc) <= addr)) {
      munmap_checked(addr,(ulong)arena->slab_size);
    }
    local_20 = arena->slab_size + local_20;
  }
  if (arena->arena != (void *)0x0) {
    munmap_checked(arena->arena,arena->prealloc);
  }
  if (local_20 == arena->used) {
    return;
  }
  __assert_fail("total == arena->used",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                ,0xe9,"void slab_arena_destroy(struct slab_arena *)");
}

Assistant:

void
slab_arena_destroy(struct slab_arena *arena)
{
	void *ptr;
	size_t total = 0;
	while ((ptr = lf_lifo_pop(&arena->cache))) {
		if (arena->arena == NULL || ptr < arena->arena ||
		    ptr >= arena->arena + arena->prealloc) {
			munmap_checked(ptr, arena->slab_size);
		}
		total += arena->slab_size;
	}
	if (arena->arena)
		munmap_checked(arena->arena, arena->prealloc);

	(void)total;
	assert(total == arena->used);
}